

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polish.c
# Opt level: O0

c_int polish(OSQPWorkspace *work)

{
  bool bVar1;
  OSQPWorkspace *work_00;
  c_float *pcVar2;
  c_float *rhs;
  OSQPWorkspace *work_01;
  OSQPWorkspace *in_RDI;
  OSQPWorkspace *unaff_retaddr;
  c_float *pol_sol;
  LinSysSolver *plsh;
  c_float *rhs_red;
  c_int exitflag;
  c_int polish_successful;
  c_int mred;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  c_int in_stack_ffffffffffffffc0;
  OSQPWorkspace *in_stack_ffffffffffffffc8;
  c_float in_stack_ffffffffffffffd0;
  csc *in_stack_ffffffffffffffd8;
  csc *in_stack_ffffffffffffffe0;
  c_int in_stack_fffffffffffffff8;
  c_int cVar3;
  
  osqp_tic((OSQPTimer *)0x110aba);
  work_00 = (OSQPWorkspace *)form_Ared(in_stack_ffffffffffffffc8);
  if ((long)work_00 < 0) {
    in_RDI->info->status_polish = -1;
    cVar3 = -1;
  }
  else {
    pcVar2 = (c_float *)
             init_linsys_solver((LinSysSolver **)work_00,in_stack_ffffffffffffffe0,
                                in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                (c_float *)in_stack_ffffffffffffffc8,
                                (linsys_solver_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                CONCAT17(in_stack_ffffffffffffffbf,
                                         CONCAT16(in_stack_ffffffffffffffbe,
                                                  in_stack_ffffffffffffffb8)));
    if (pcVar2 == (c_float *)0x0) {
      rhs = (c_float *)malloc(((long)&work_00->data + in_RDI->data->n) * 8);
      if (rhs == (c_float *)0x0) {
        in_RDI->info->status_polish = -1;
        csc_spfree((csc *)0x110bda);
        cVar3 = -1;
      }
      else {
        form_rhs_red(in_RDI,rhs);
        work_01 = (OSQPWorkspace *)
                  vec_copy((c_float *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        if (work_01 == (OSQPWorkspace *)0x0) {
          in_RDI->info->status_polish = -1;
          csc_spfree((csc *)0x110c43);
          free(rhs);
          cVar3 = -1;
        }
        else {
          (*(code *)in_stack_ffffffffffffffc8->linsys_solver)(in_stack_ffffffffffffffc8,work_01);
          cVar3 = iterative_refinement(work_00,(LinSysSolver *)in_stack_ffffffffffffffe0,pcVar2,rhs)
          ;
          if (cVar3 == 0) {
            prea_vec_copy((c_float *)work_01,in_RDI->pol->x,in_RDI->data->n);
            mat_vec(in_RDI->data->A,in_RDI->pol->x,in_RDI->pol->z,0);
            get_ypol_from_yred(work_01,(c_float *)
                                       CONCAT17(in_stack_ffffffffffffffbf,
                                                CONCAT16(in_stack_ffffffffffffffbe,
                                                         in_stack_ffffffffffffffb8)));
            project_normalcone(in_RDI,in_RDI->pol->z,in_RDI->pol->y);
            update_info(unaff_retaddr,in_stack_fffffffffffffff8,(c_int)in_RDI,(c_int)work_00);
            if ((((in_RDI->info->pri_res <= in_RDI->pol->pri_res) ||
                 (bVar1 = true, in_RDI->info->dua_res <= in_RDI->pol->dua_res)) &&
                ((in_RDI->info->pri_res <= in_RDI->pol->pri_res ||
                 (pcVar2 = &in_RDI->info->dua_res, bVar1 = true, 1e-10 < *pcVar2 || *pcVar2 == 1e-10
                 )))) && (bVar1 = false, in_RDI->pol->dua_res < in_RDI->info->dua_res)) {
              pcVar2 = &in_RDI->info->pri_res;
              bVar1 = *pcVar2 <= 1e-10 && *pcVar2 != 1e-10;
            }
            if (bVar1) {
              in_RDI->info->obj_val = in_RDI->pol->obj_val;
              in_RDI->info->pri_res = in_RDI->pol->pri_res;
              in_RDI->info->dua_res = in_RDI->pol->dua_res;
              in_RDI->info->status_polish = 1;
              prea_vec_copy(in_RDI->pol->x,in_RDI->x,in_RDI->data->n);
              prea_vec_copy(in_RDI->pol->z,in_RDI->z,in_RDI->data->m);
              prea_vec_copy(in_RDI->pol->y,in_RDI->y,in_RDI->data->m);
              if (in_RDI->settings->verbose != 0) {
                print_polish(work_01);
              }
            }
            else {
              in_RDI->info->status_polish = -1;
            }
            (*(code *)in_stack_ffffffffffffffc8->pol)(in_stack_ffffffffffffffc8);
            csc_spfree((csc *)0x110fce);
            free(rhs);
            free(work_01);
            cVar3 = 0;
          }
          else {
            in_RDI->info->status_polish = -1;
            csc_spfree((csc *)0x110cbb);
            free(rhs);
            free(work_01);
            cVar3 = -1;
          }
        }
      }
    }
    else {
      in_RDI->info->status_polish = -1;
      if (in_RDI->pol->Ared != (csc *)0x0) {
        csc_spfree((csc *)0x110b81);
      }
      cVar3 = 1;
    }
  }
  return cVar3;
}

Assistant:

c_int polish(OSQPWorkspace *work) {
  c_int mred, polish_successful, exitflag;
  c_float *rhs_red;
  LinSysSolver *plsh;
  c_float *pol_sol; // Polished solution

#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  // Form Ared by assuming the active constraints and store in work->pol->Ared
  mred = form_Ared(work);
  if (mred < 0) { // work->pol->red = OSQP_NULL
    // Polishing failed
    work->info->status_polish = -1;

    return -1;
  }

  // Form and factorize reduced KKT
  exitflag = init_linsys_solver(&plsh, work->data->P, work->pol->Ared,
                                work->settings->delta, OSQP_NULL,
                                work->settings->linsys_solver, 1);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    if (work->pol->Ared) csc_spfree(work->pol->Ared);

    return 1;
  }

  // Form reduced right-hand side rhs_red
  rhs_red = c_malloc(sizeof(c_float) * (work->data->n + mred));
  if (!rhs_red) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);

    return -1;
  }
  form_rhs_red(work, rhs_red);

  pol_sol = vec_copy(rhs_red, work->data->n + mred);
  if (!pol_sol) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
  
    return -1;
  }

  // Solve the reduced KKT system
  plsh->solve(plsh, pol_sol);

  // Perform iterative refinement to compensate for the regularization error
  exitflag = iterative_refinement(work, plsh, pol_sol, rhs_red);

  if (exitflag) {
    // Polishing failed
    work->info->status_polish = -1;

    // Memory clean-up
    csc_spfree(work->pol->Ared);
    c_free(rhs_red);
    c_free(pol_sol);
  
    return -1;
  }

  // Store the polished solution (x,z,y)
  prea_vec_copy(pol_sol, work->pol->x, work->data->n);   // pol->x
  mat_vec(work->data->A, work->pol->x, work->pol->z, 0); // pol->z
  get_ypol_from_yred(work, pol_sol + work->data->n);     // pol->y

  // Ensure (z,y) satisfies normal cone constraint
  project_normalcone(work, work->pol->z, work->pol->y);

  // Compute primal and dual residuals at the polished solution
  update_info(work, 0, 1, 1);

  // Check if polish was successful
  polish_successful = (work->pol->pri_res < work->info->pri_res &&
                       work->pol->dua_res < work->info->dua_res) || // Residuals
                                                                    // are
                                                                    // reduced
                      (work->pol->pri_res < work->info->pri_res &&
                       work->info->dua_res < 1e-10) ||              // Dual
                                                                    // residual
                                                                    // already
                                                                    // tiny
                      (work->pol->dua_res < work->info->dua_res &&
                       work->info->pri_res < 1e-10);                // Primal
                                                                    // residual
                                                                    // already
                                                                    // tiny

  if (polish_successful) {
    // Update solver information
    work->info->obj_val       = work->pol->obj_val;
    work->info->pri_res       = work->pol->pri_res;
    work->info->dua_res       = work->pol->dua_res;
    work->info->status_polish = 1;

    // Update (x, z, y) in ADMM iterations
    // NB: z needed for warm starting
    prea_vec_copy(work->pol->x, work->x, work->data->n);
    prea_vec_copy(work->pol->z, work->z, work->data->m);
    prea_vec_copy(work->pol->y, work->y, work->data->m);

    // Print summary
#ifdef PRINTING

    if (work->settings->verbose) print_polish(work);
#endif /* ifdef PRINTING */
  } else { // Polishing failed
    work->info->status_polish = -1;

    // TODO: Try to find a better solution on the line connecting ADMM
    //       and polished solution
  }

  // Memory clean-up
  plsh->free(plsh);

  // Checks that they are not NULL are already performed earlier
  csc_spfree(work->pol->Ared);
  c_free(rhs_red);
  c_free(pol_sol);

  return 0;
}